

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O2

char vault_occupied(char *array)

{
  char cVar1;
  
  do {
    cVar1 = *array;
    if ((long)cVar1 == 0) {
      return cVar1;
    }
    array = array + 1;
  } while (*(char *)((long)level->monsters + (long)cVar1 * 0xd8 + 0x335c) != '\x04');
  return cVar1;
}

Assistant:

char vault_occupied(char *array)
{
	char *ptr;

	for (ptr = array; *ptr; ptr++)
		if (level->rooms[*ptr - ROOMOFFSET].rtype == VAULT)
			return *ptr;
	return '\0';
}